

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

char * google::protobuf::FileDescriptor::SyntaxName(Syntax syntax)

{
  int in_EDI;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  LogMessage *this;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  LogMessage local_48;
  char *local_8;
  
  if (in_EDI == 0) {
    local_8 = "unknown";
  }
  else if (in_EDI == 2) {
    local_8 = "proto2";
  }
  else if (in_EDI == 3) {
    local_8 = "proto3";
  }
  else {
    this = &local_48;
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_EDI,in_stack_ffffffffffffffa0),
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff98 >> 0x20),(char *)this,
               in_stack_ffffffffffffff8c);
    internal::LogMessage::operator<<
              (this,(char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogFinisher::operator=
              ((LogFinisher *)this,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    internal::LogMessage::~LogMessage((LogMessage *)0x49fe7f);
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char* FileDescriptor::SyntaxName(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case SYNTAX_PROTO2:
      return "proto2";
    case SYNTAX_PROTO3:
      return "proto3";
    case SYNTAX_UNKNOWN:
      return "unknown";
  }
  GOOGLE_LOG(FATAL) << "can't reach here.";
  return nullptr;
}